

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcp_api.c
# Opt level: O2

void pcp_delete_flow(pcp_flow_t *f)

{
  pcp_flow_s *ppVar1;
  
  while (f != (pcp_flow_t *)0x0) {
    ppVar1 = f->next_child;
    pcp_delete_flow_intern(f);
    f = ppVar1;
  }
  return;
}

Assistant:

void pcp_delete_flow(pcp_flow_t *f) {
    pcp_flow_t *fiter = f;
    pcp_flow_t *fnext = NULL;

    while (fiter) {
        fnext = fiter->next_child;
        pcp_delete_flow_intern(fiter);
        fiter = fnext;
    }
}